

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConfigData::~ConfigData(ConfigData *this)

{
  pointer pcVar1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->testsOrTags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->reporterNames);
  pcVar1 = (this->processName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->processName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->outputFilename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->outputFilename).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ConfigData()
			: listTests(false),
			listTags(false),
			listReporters(false),
			listTestNamesOnly(false),
			showSuccessfulTests(false),
			shouldDebugBreak(false),
			noThrow(false),
			showHelp(false),
			showInvisibles(false),
			filenamesAsTags(false),
			abortAfter(-1),
			rngSeed(0),
			verbosity(Verbosity::Normal),
			warnings(WarnAbout::Nothing),
			showDurations(ShowDurations::DefaultForReporter),
			runOrder(RunTests::InDeclarationOrder),
			useColour(UseColour::Auto)
		{}